

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_writer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::PrintRuntimeImports
          (ImportWriter *this,Printer *p,bool default_cpp_symbol)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Printer *pPVar2;
  objectivec *this_00;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pointer value_00;
  long lVar3;
  string_view framework_name;
  bool default_cpp_symbol_local;
  allocator<char> local_525;
  allocator<char> local_524;
  allocator<char> local_523;
  allocator<char> local_522;
  allocator<char> local_521;
  Printer *p_local;
  _Any_data local_518;
  code *local_508;
  code *pcStack_500;
  undefined1 *local_4f8;
  undefined8 local_4f0;
  undefined1 local_4e8 [8];
  undefined8 uStack_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8 [8];
  undefined8 uStack_4c0;
  char *local_4b8;
  size_type local_4b0;
  char local_4a8 [8];
  undefined8 uStack_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  pointer local_490;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  Sub local_3c8;
  undefined1 local_310 [64];
  __index_type local_2d0;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  bool local_2a8;
  bool local_260;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  default_cpp_symbol_local = default_cpp_symbol;
  p_local = p;
  if ((this->runtime_import_prefix_)._M_string_length == 0) {
    if (this->for_bundled_proto_ == true) {
      if (default_cpp_symbol) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/objectivec/import_writer.cc"
                   ,0xc1,0x13,"!default_cpp_symbol");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_3c8);
      }
      pbVar1 = (this->protobuf_imports_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (value = (this->protobuf_imports_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pPVar2 = p_local, value != pbVar1;
          value = value + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"header",(allocator<char> *)local_518._M_pod_data);
        io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3c8,&local_428,value);
        google::protobuf::io::Printer::Emit
                  (pPVar2,&local_3c8,1,0x32,"\n                #import \"$header$\"\n              "
                  );
        io::Printer::Sub::~Sub(&local_3c8);
        std::__cxx11::string::~string((string *)&local_428);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_448,"cpp_symbol",&local_521);
      this_00 = (objectivec *)strlen("Protobuf");
      framework_name._M_str = in_RCX;
      framework_name._M_len = (size_t)"Protobuf";
      ProtobufFrameworkImportSymbol_abi_cxx11_(&local_488,this_00,framework_name);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_448,&local_488);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,"maybe_default_cpp_symbol",&local_522);
      local_310._0_8_ = local_310 + 0x10;
      if (local_4b8 == local_4a8) {
        local_310._24_8_ = uStack_4a0;
      }
      else {
        local_310._0_8_ = local_4b8;
      }
      local_310._8_8_ = local_4b0;
      local_4b0 = 0;
      local_4a8[0] = '\0';
      local_508 = (code *)0x0;
      pcStack_500 = (code *)0x0;
      local_518._M_unused._M_object = (void *)0x0;
      local_518._8_8_ = 0;
      local_4b8 = local_4a8;
      local_518._M_unused._M_object = operator_new(0x18);
      *(bool **)local_518._M_unused._0_8_ = &default_cpp_symbol_local;
      *(Printer ***)((long)local_518._M_unused._0_8_ + 8) = &p_local;
      *(code *)((long)local_518._M_unused._0_8_ + 0x10) = (code)0x0;
      pcStack_500 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_508 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_310 + 0x20),
                 (function<bool_()> *)&local_518);
      std::_Function_base::~_Function_base((_Function_base *)&local_518);
      local_2c8._M_p = (pointer)&local_2b8;
      local_2c0 = 0;
      local_2b8._M_local_buf[0] = '\0';
      local_2a8 = false;
      if (local_2d0 == '\x01') {
        std::__cxx11::string::assign((char *)&local_2c8);
      }
      local_260 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"framework_name",&local_523);
      io::Printer::Sub::Sub<char_const*const&>(&local_258,&local_468,&ProtobufLibraryFrameworkName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"framework_imports",&local_524);
      local_1a0 = local_190;
      if (local_4d8 == local_4c8) {
        uStack_188 = uStack_4c0;
      }
      else {
        local_1a0 = local_4d8;
      }
      local_198 = local_4d0;
      local_4d0 = 0;
      local_4c8[0] = 0;
      local_508 = (code *)0x0;
      pcStack_500 = (code *)0x0;
      local_518._M_unused._M_object = (void *)0x0;
      local_518._8_8_ = 0;
      local_4d8 = local_4c8;
      local_518._M_unused._M_object = operator_new(0x18);
      *(ImportWriter **)local_518._M_unused._0_8_ = this;
      *(Printer ***)((long)local_518._M_unused._0_8_ + 8) = &p_local;
      *(code *)((long)local_518._M_unused._0_8_ + 0x10) = (code)0x0;
      pcStack_500 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_508 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_180,(function<bool_()> *)&local_518);
      std::_Function_base::~_Function_base((_Function_base *)&local_518);
      local_158 = local_148;
      local_150 = 0;
      local_148[0] = 0;
      local_138 = 0;
      if (local_160 == '\x01') {
        std::__cxx11::string::assign((char *)&local_158);
      }
      local_f0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"raw_imports",&local_525);
      local_e8 = local_d8;
      if (local_4f8 == local_4e8) {
        uStack_d0 = uStack_4e0;
      }
      else {
        local_e8 = local_4f8;
      }
      local_e0 = local_4f0;
      local_4f0 = 0;
      local_4e8[0] = 0;
      local_508 = (code *)0x0;
      pcStack_500 = (code *)0x0;
      local_518._M_unused._M_object = (void *)0x0;
      local_518._8_8_ = 0;
      local_4f8 = local_4e8;
      local_518._M_unused._M_object = operator_new(0x18);
      *(ImportWriter **)local_518._M_unused._0_8_ = this;
      *(Printer ***)((long)local_518._M_unused._0_8_ + 8) = &p_local;
      *(code *)((long)local_518._M_unused._0_8_ + 0x10) = (code)0x0;
      pcStack_500 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_508 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_c8,(function<bool_()> *)&local_518);
      std::_Function_base::~_Function_base((_Function_base *)&local_518);
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      if (local_a8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_a0);
      }
      local_38 = 0;
      google::protobuf::io::Printer::Emit
                (p,&local_3c8,5,0x95,
                 "\n        $maybe_default_cpp_symbol$\n\n        #if $cpp_symbol$\n         $framework_imports$\n        #else\n         $raw_imports$\n        #endif\n      "
                );
      lVar3 = 0x2e0;
      do {
        io::Printer::Sub::~Sub((Sub *)((long)&local_3c8.key_._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != -0xb8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_448);
    }
  }
  else {
    local_498 = &this->runtime_import_prefix_;
    local_490 = (this->protobuf_imports_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (value_00 = (this->protobuf_imports_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pPVar2 = p_local,
        value_00 != local_490; value_00 = value_00 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"import_prefix",(allocator<char> *)local_518._M_pod_data);
      io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3c8,&local_3e8,local_498);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"header",(allocator<char> *)&local_488);
      io::Printer::Sub::Sub<std::__cxx11::string_const&>((Sub *)local_310,&local_408,value_00);
      google::protobuf::io::Printer::Emit
                (pPVar2,&local_3c8,2,0x42,
                 "\n                #import \"$import_prefix$/$header$\"\n              ");
      lVar3 = 0xb8;
      do {
        io::Printer::Sub::~Sub((Sub *)((long)&local_3c8.key_._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != -0xb8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
  }
  return;
}

Assistant:

void ImportWriter::PrintRuntimeImports(io::Printer* p,
                                       bool default_cpp_symbol) const {
  // Given an override, use that.
  if (!runtime_import_prefix_.empty()) {
    for (const auto& header : protobuf_imports_) {
      p->Emit({{"import_prefix", runtime_import_prefix_}, {"header", header}},
              R"objc(
                #import "$import_prefix$/$header$"
              )objc");
    }
    return;
  }

  // If bundled, no need to do the framework support below.
  if (for_bundled_proto_) {
    ABSL_DCHECK(!default_cpp_symbol);
    for (const auto& header : protobuf_imports_) {
      p->Emit({{"header", header}},
              R"objc(
                #import "$header$"
              )objc");
    }
    return;
  }

  p->Emit(
      {
          {"cpp_symbol",
           ProtobufFrameworkImportSymbol(ProtobufLibraryFrameworkName)},
          {"maybe_default_cpp_symbol",
           [&] {
             if (default_cpp_symbol) {
               p->Emit(
                   R"objc(
                     // This CPP symbol can be defined to use imports that match up to the framework
                     // imports needed when using CocoaPods.
                     #if !defined($cpp_symbol$)
                      #define $cpp_symbol$ 0
                     #endif
                   )objc");
             }
           }},
          {"framework_name", ProtobufLibraryFrameworkName},
          {"framework_imports",
           [&] {
             for (const auto& header : protobuf_imports_) {
               p->Emit({{"header", header}},
                       R"objc(
                         #import <$framework_name$/$header$>
                       )objc");
             }
           }},
          {"raw_imports",
           [&] {
             for (const auto& header : protobuf_imports_) {
               p->Emit({{"header", header}},
                       R"objc(
                         #import "$header$"
                       )objc");
             }
           }},
      },
      R"objc(
        $maybe_default_cpp_symbol$

        #if $cpp_symbol$
         $framework_imports$
        #else
         $raw_imports$
        #endif
      )objc");
}